

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_start_and_close(void)

{
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  int in_ECX;
  int extraout_EDX;
  long lVar4;
  char *pcVar5;
  uv_fs_event_t *puVar6;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  undefined1 auStack_6b0 [16];
  uv__queue uStack_6a0;
  uv__queue *puStack_690;
  uv_timer_t uStack_688;
  uv_fs_event_t uStack_610;
  uv_loop_t *puStack_5a8;
  uv_fs_event_t *puStack_5a0;
  long lStack_598;
  long lStack_590;
  uv_loop_t *puStack_588;
  long lStack_580;
  long lStack_578;
  uv_loop_t *puStack_570;
  size_t sStack_560;
  size_t sStack_558;
  size_t sStack_550;
  char acStack_548 [1032];
  uv_loop_t *puStack_140;
  undefined1 local_f0 [16];
  uv_fs_event_t local_e0;
  uv_fs_event_t local_78;
  
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar3,&local_78);
  local_e0.data = (void *)(long)iVar2;
  local_f0._0_8_ = (uv_loop_t *)0x0;
  if (local_e0.data == (void *)0x0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&local_78,fs_event_cb_dir,"watch_dir",0);
    local_e0.data = (void *)(long)iVar2;
    local_f0._0_8_ = (uv_loop_t *)0x0;
    if (local_e0.data != (void *)0x0) goto LAB_00185f68;
    iVar2 = uv_fs_event_init(puVar3,&local_e0);
    local_f0._0_8_ = SEXT48(iVar2);
    local_f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_f0._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f77;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&local_e0,fs_event_cb_dir,"watch_dir",0);
    local_f0._0_8_ = SEXT48(iVar2);
    local_f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_f0._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f86;
    uv_close((uv_handle_t *)&local_e0,close_cb);
    uv_close((uv_handle_t *)&local_78,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_f0._0_8_ = (uv_loop_t *)0x2;
    local_f0._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_f0._8_8_ != (uv_loop_t *)0x2) goto LAB_00185f95;
    remove("watch_dir/");
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_f0._0_8_ = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(puVar3);
    local_f0._8_8_ = SEXT48(iVar2);
    if (local_f0._0_8_ == local_f0._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00185f68:
    run_test_fs_event_start_and_close_cold_2();
LAB_00185f77:
    run_test_fs_event_start_and_close_cold_3();
LAB_00185f86:
    run_test_fs_event_start_and_close_cold_4();
LAB_00185f95:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar6 = (uv_fs_event_t *)local_f0;
  pcVar5 = local_f0 + 8;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    if (in_ECX != 0) goto LAB_00186081;
    if (extraout_EDX != 2) goto LAB_00186090;
    iVar2 = strcmp(pcVar5,"file1");
    if (iVar2 != 0) goto LAB_0018609f;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00186081:
    fs_event_cb_dir_cold_2();
LAB_00186090:
    fs_event_cb_dir_cold_3();
LAB_0018609f:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_570 = (uv_loop_t *)0x1860d3;
  puStack_140 = puVar3;
  puVar3 = uv_default_loop();
  puStack_570 = (uv_loop_t *)0x1860e2;
  create_dir("watch_dir");
  puStack_570 = (uv_loop_t *)0x1860ee;
  create_dir("watch_dir/subfolder");
  lVar4 = 0;
  sVar1 = sStack_560;
  do {
    sStack_560 = sVar1;
    puStack_570 = (uv_loop_t *)0x18610c;
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0;
    if (sStack_558 != 0) {
LAB_001863fc:
      puStack_570 = (uv_loop_t *)0x18640b;
      run_test_fs_event_getpath_cold_1();
      goto LAB_0018640b;
    }
    sStack_550 = 0x400;
    puStack_570 = (uv_loop_t *)0x186143;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_548,&sStack_550);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0xffffffffffffffea;
    if (sStack_558 != 0xffffffffffffffea) {
LAB_001863ed:
      puStack_570 = (uv_loop_t *)0x1863fc;
      run_test_fs_event_getpath_cold_2();
      goto LAB_001863fc;
    }
    pcVar5 = *(char **)((long)&DAT_00268bc0 + lVar4);
    puStack_570 = (uv_loop_t *)0x186183;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar5,0);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0;
    if (sStack_558 != 0) {
LAB_001863de:
      puStack_570 = (uv_loop_t *)0x1863ed;
      run_test_fs_event_getpath_cold_3();
      goto LAB_001863ed;
    }
    sStack_550 = 0;
    puStack_570 = (uv_loop_t *)0x1861ba;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_548,&sStack_550);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0xffffffffffffff97;
    if (sStack_558 != 0xffffffffffffff97) {
LAB_001863cf:
      puStack_570 = (uv_loop_t *)0x1863de;
      run_test_fs_event_getpath_cold_4();
      goto LAB_001863de;
    }
    sStack_558 = sStack_550;
    sStack_560 = 0x400;
    if (0x3ff < (long)sStack_550) {
LAB_001863c0:
      puStack_570 = (uv_loop_t *)0x1863cf;
      run_test_fs_event_getpath_cold_5();
      goto LAB_001863cf;
    }
    puStack_570 = (uv_loop_t *)0x18620a;
    sStack_560 = strlen(pcVar5);
    sStack_560 = sStack_560 + 1;
    if (sStack_558 != sStack_560) {
LAB_001863b1:
      puStack_570 = (uv_loop_t *)0x1863c0;
      run_test_fs_event_getpath_cold_6();
      goto LAB_001863c0;
    }
    puStack_570 = (uv_loop_t *)0x186230;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_548,&sStack_550);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0;
    if (sStack_558 != 0) {
LAB_001863a2:
      puStack_570 = (uv_loop_t *)0x1863b1;
      run_test_fs_event_getpath_cold_7();
      goto LAB_001863b1;
    }
    sStack_558 = sStack_550;
    puStack_570 = (uv_loop_t *)0x186262;
    sStack_560 = strlen(pcVar5);
    if (sStack_558 != sStack_560) {
LAB_00186393:
      puStack_570 = (uv_loop_t *)0x1863a2;
      run_test_fs_event_getpath_cold_8();
      goto LAB_001863a2;
    }
    puStack_570 = (uv_loop_t *)0x186282;
    iVar2 = strcmp(acStack_548,pcVar5);
    if (iVar2 != 0) {
LAB_0018638e:
      puStack_570 = (uv_loop_t *)0x186393;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00186393;
    }
    puStack_570 = (uv_loop_t *)0x186292;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_558 = (size_t)iVar2;
    sStack_560 = 0;
    if (sStack_558 != 0) {
LAB_0018637f:
      puStack_570 = (uv_loop_t *)0x18638e;
      run_test_fs_event_getpath_cold_10();
      goto LAB_0018638e;
    }
    puStack_570 = (uv_loop_t *)0x1862c1;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_570 = (uv_loop_t *)0x1862cb;
    uv_run(puVar3,UV_RUN_DEFAULT);
    sStack_558 = 1;
    sStack_560 = (size_t)close_cb_called;
    if (sStack_560 != 1) {
      puStack_570 = (uv_loop_t *)0x18637f;
      run_test_fs_event_getpath_cold_11();
      goto LAB_0018637f;
    }
    close_cb_called = 0;
    lVar4 = lVar4 + 8;
    sVar1 = 1;
  } while (lVar4 != 0x28);
  puStack_570 = (uv_loop_t *)0x186314;
  remove("watch_dir/");
  puStack_570 = (uv_loop_t *)0x186325;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_570 = (uv_loop_t *)0x18632f;
  uv_run(puVar3,UV_RUN_DEFAULT);
  sStack_558 = 0;
  puStack_570 = (uv_loop_t *)0x186340;
  iVar2 = uv_loop_close(puVar3);
  sStack_560 = (size_t)iVar2;
  if (sStack_558 == sStack_560) {
    puStack_570 = (uv_loop_t *)0x18635c;
    uv_library_shutdown();
    return 0;
  }
LAB_0018640b:
  puStack_570 = (uv_loop_t *)run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  puStack_588 = (uv_loop_t *)0x186424;
  puStack_570 = puVar3;
  puVar3 = uv_default_loop();
  puStack_588 = (uv_loop_t *)0x186438;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_588 = (uv_loop_t *)0x186442;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_578 = 0;
  puStack_588 = (uv_loop_t *)0x186450;
  loop = uv_default_loop();
  puStack_588 = (uv_loop_t *)0x186458;
  iVar2 = uv_loop_close(loop);
  lStack_580 = (long)iVar2;
  if (lStack_578 == lStack_580) {
    puStack_588 = (uv_loop_t *)0x18646e;
    uv_library_shutdown();
    return 0;
  }
  puStack_588 = (uv_loop_t *)run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_5a0 = (uv_fs_event_t *)0x18648d;
  puStack_588 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5a0 = (uv_fs_event_t *)0x18649f;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  lStack_590 = (long)iVar2;
  lStack_598 = 0;
  if (lStack_590 == 0) {
    puStack_5a0 = (uv_fs_event_t *)0x1864d9;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_001865ac;
    puStack_5a0 = (uv_fs_event_t *)0x1864ed;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_590 = (long)iVar2;
    lStack_598 = 0;
    if (lStack_590 != 0) goto LAB_001865b1;
    puStack_5a0 = (uv_fs_event_t *)0x186527;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_001865be;
    puStack_5a0 = (uv_fs_event_t *)0x18653b;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_590 = (long)iVar2;
    lStack_598 = 0;
    if (lStack_590 != 0) goto LAB_001865c3;
    puStack_5a0 = (uv_fs_event_t *)0x186566;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_5a0 = (uv_fs_event_t *)0x186570;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_590 = 0;
    puStack_5a0 = (uv_fs_event_t *)0x186581;
    iVar2 = uv_loop_close(puVar3);
    lStack_598 = (long)iVar2;
    if (lStack_590 == lStack_598) {
      puStack_5a0 = (uv_fs_event_t *)0x186597;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5a0 = (uv_fs_event_t *)0x1865ac;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_001865ac:
    puStack_5a0 = (uv_fs_event_t *)0x1865b1;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_001865b1:
    puStack_5a0 = (uv_fs_event_t *)0x1865be;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_001865be:
    puStack_5a0 = (uv_fs_event_t *)0x1865c3;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_001865c3:
    puStack_5a0 = (uv_fs_event_t *)0x1865d0;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_5a0 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_5a0 = &fs_event;
  puVar6 = (uv_fs_event_t *)auStack_6b0;
  uStack_6a0.next = (uv__queue *)0x746e6576655f7366;
  uStack_6a0.prev = (uv__queue *)0x6e695f706f74735f;
  puStack_690 = (uv__queue *)0x7478742e62635f;
  puStack_5a8 = puVar3;
  remove((char *)&uStack_6a0);
  create_file((char *)&uStack_6a0);
  puVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(puVar3,&uStack_610);
  uStack_688.data = (void *)(long)iVar2;
  auStack_6b0._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)uStack_688.data == (uv__queue *)0x0) {
    iVar2 = uv_fs_event_start(&uStack_610,fs_event_cb_stop,(char *)&uStack_6a0,0);
    uStack_688.data = (void *)(long)iVar2;
    auStack_6b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_688.data != (uv__queue *)0x0) goto LAB_0018687e;
    uStack_688.data = &uStack_6a0;
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&uStack_688);
    auStack_6b0._0_8_ = SEXT48(iVar2);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_0018688b;
    iVar2 = uv_timer_start(&uStack_688,timer_cb_touch,100,0);
    auStack_6b0._0_8_ = SEXT48(iVar2);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_00186898;
    auStack_6b0._0_8_ = SEXT48(fs_event_cb_stop_calls);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a5;
    auStack_6b0._0_8_ = SEXT48(timer_cb_touch_called);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868b2;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6b0._0_8_ = SEXT48(iVar2);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868bf;
    auStack_6b0._0_8_ = (uv_loop_t *)0x1;
    auStack_6b0._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6b0._8_8_ != (uv_loop_t *)0x1) goto LAB_001868cc;
    auStack_6b0._0_8_ = (uv_loop_t *)0x1;
    auStack_6b0._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)auStack_6b0._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d9;
    uv_close((uv_handle_t *)&uStack_610,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6b0._0_8_ = SEXT48(iVar2);
    auStack_6b0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6b0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868e6;
    auStack_6b0._0_8_ = (uv_loop_t *)0x1;
    auStack_6b0._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6b0._8_8_ == (uv_loop_t *)0x1) {
      remove((char *)&uStack_6a0);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_6b0._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_6b0._8_8_ = SEXT48(iVar2);
      if (auStack_6b0._0_8_ == auStack_6b0._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00186900;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018687e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018688b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_00186898:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868a5:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868b2:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868bf:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868cc:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868d9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868e6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186900:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(puVar6);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}